

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O2

ares_bool_t opt_retry_cb(char prefix,char *name,ares_bool_t is_true,char *value)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_register_00000014;
  
  iVar1 = ares_str_isnum(value,name,CONCAT44(in_register_00000014,is_true));
  if (iVar1 == 0) {
    builtin_strncpy(global_config.error,"value not numeric",0x12);
  }
  else {
    uVar2 = strtoul(value,(char **)0x0,10);
    global_config.opts.tries = uVar2 + 1;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static ares_bool_t opt_retry_cb(char prefix, const char *name,
                                ares_bool_t is_true, const char *value)
{
  (void)prefix;
  (void)name;
  (void)is_true;

  if (!ares_str_isnum(value)) {
    snprintf(global_config.error, sizeof(global_config.error),
             "value not numeric");
    return ARES_FALSE;
  }

  global_config.opts.tries = strtoul(value, NULL, 10) + 1;
  return ARES_TRUE;
}